

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O3

hts_itr_t * hts_itr_query(hts_idx_t *idx,int tid,int beg,int end,hts_readrec_func *readrec)

{
  khint_t kVar1;
  bidx_t *pbVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  hts_itr_t *phVar7;
  int *__ptr;
  hts_pair64_t *a;
  byte bVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  uint64_t *puVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  khint_t k_1;
  long lVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  uint uVar25;
  uint uVar26;
  uint64_t uVar27;
  bool bVar28;
  undefined4 local_78;
  
  if (-1 < tid) {
    if (beg < 1) {
      beg = 0;
    }
    if (end < beg) {
      return (hts_itr_t *)0x0;
    }
    if (idx->n <= tid) {
      return (hts_itr_t *)0x0;
    }
    pbVar2 = idx->bidx[(uint)tid];
    if (pbVar2 == (bidx_t *)0x0) {
      return (hts_itr_t *)0x0;
    }
    phVar7 = (hts_itr_t *)calloc(1,0x50);
    phVar7->tid = tid;
    phVar7->beg = beg;
    phVar7->end = end;
    phVar7->i = -1;
    phVar7->readrec = readrec;
    iVar13 = idx->n_lvls;
    uVar17 = ((uint)beg >> ((byte)idx->min_shift & 0x1f)) +
             (uint)((ulong)(uint)~(-1 << ((char)iVar13 * '\x03' & 0x1fU)) * 0x92492493 >> 0x22);
    uVar19 = pbVar2->n_buckets;
    uVar18 = uVar19 - 1;
    do {
      if (uVar19 == 0) {
        uVar14 = 0;
LAB_0010e9da:
        if (uVar14 != uVar19) {
          if (uVar17 == 0) {
            uVar14 = 0;
          }
          uVar15 = (ulong)uVar14;
          if ((uVar17 != 0) || (uVar19 == 0)) goto LAB_0010ec39;
          goto LAB_0010ebe6;
        }
      }
      else {
        iVar22 = 1;
        uVar14 = uVar18 & uVar17;
        do {
          bVar8 = (char)uVar14 * '\x02' & 0x1e;
          uVar25 = pbVar2->flags[uVar14 >> 4] >> bVar8;
          if (((uVar25 & 2) != 0) || (((uVar25 & 1) == 0 && (pbVar2->keys[uVar14] == uVar17)))) {
            if ((pbVar2->flags[uVar14 >> 4] >> bVar8 & 3) != 0) {
              uVar14 = uVar19;
            }
            goto LAB_0010e9da;
          }
          uVar14 = uVar14 + iVar22 & uVar18;
          iVar22 = iVar22 + 1;
        } while (uVar14 != (uVar18 & uVar17));
      }
      uVar14 = uVar17 - 1;
      bVar28 = (int)((uVar14 & 0xfffffff8) + 1) < (int)uVar17;
      uVar17 = (int)uVar14 >> 3;
      if (bVar28) {
        uVar17 = uVar14;
      }
    } while (uVar17 != 0);
    if (uVar19 == 0) {
      uVar15 = 0;
LAB_0010ec39:
      if ((uint)uVar15 == uVar19) {
        uVar27 = 0;
      }
      else {
        uVar27 = pbVar2->vals[uVar15].loff;
      }
    }
    else {
LAB_0010ebe6:
      uVar27 = 0;
      iVar22 = 1;
      uVar15 = 0;
      do {
        bVar8 = (char)uVar15 * '\x02' & 0x1e;
        uVar17 = pbVar2->flags[uVar15 >> 4] >> bVar8;
        if (((uVar17 & 2) != 0) || (((uVar17 & 1) == 0 && (pbVar2->keys[uVar15] == 0)))) {
          if ((pbVar2->flags[uVar15 >> 4] >> bVar8 & 3) != 0) {
            uVar15 = (ulong)uVar19;
          }
          goto LAB_0010ec39;
        }
        uVar17 = (int)uVar15 + iVar22;
        iVar22 = iVar22 + 1;
        uVar17 = uVar17 & uVar18;
        uVar15 = (ulong)uVar17;
      } while (uVar17 != 0);
    }
    if (end <= beg) {
      return phVar7;
    }
    iVar22 = idx->min_shift + iVar13 + iVar13 * 2;
    lVar21 = 1L << ((byte)iVar22 & 0x3f);
    if (end <= lVar21) {
      lVar21 = (long)end;
    }
    if (iVar13 < 0) {
      return phVar7;
    }
    __ptr = (int *)0x0;
    iVar11 = 0;
    uVar18 = 0;
    iVar6 = 0;
    iVar23 = 0;
    do {
      uVar19 = (uint)beg >> ((byte)iVar22 & 0x3f);
      iVar24 = iVar6 + uVar19;
      iVar3 = (int)(lVar21 + -1 >> ((byte)iVar22 & 0x3f));
      iVar12 = iVar6 + iVar3;
      iVar5 = iVar12 - iVar24;
      if (iVar11 < (int)(iVar5 + uVar18 + 1)) {
        uVar17 = iVar5 + uVar18;
        uVar17 = (int)uVar17 >> 1 | uVar17;
        uVar17 = (int)uVar17 >> 2 | uVar17;
        uVar17 = (int)uVar17 >> 4 | uVar17;
        uVar17 = (int)uVar17 >> 8 | uVar17;
        uVar17 = (int)uVar17 >> 0x10 | uVar17;
        iVar11 = uVar17 + 1;
        __ptr = (int *)realloc(__ptr,(long)(int)uVar17 * 4 + 4);
        (phVar7->bins).a = __ptr;
      }
      if (iVar24 <= iVar12) {
        lVar10 = 0;
        do {
          __ptr[(int)uVar18 + lVar10] = iVar24 + (int)lVar10;
          lVar10 = lVar10 + 1;
        } while ((iVar3 - uVar19) + 1 != (int)lVar10);
        uVar18 = uVar18 + (int)lVar10;
      }
      iVar22 = iVar22 + -3;
      iVar6 = (1 << ((char)iVar23 * '\x03' & 0x1fU)) + iVar6;
      bVar28 = iVar23 != iVar13;
      iVar23 = iVar23 + 1;
    } while (bVar28);
    (phVar7->bins).n = uVar18;
    (phVar7->bins).m = iVar11;
    if ((int)uVar18 < 1) {
      return phVar7;
    }
    kVar1 = pbVar2->n_buckets;
    uVar15 = 0;
    iVar13 = 0;
    do {
      uVar19 = 0;
      if (kVar1 == 0) {
LAB_0010ee46:
        if (uVar19 != kVar1) {
          iVar13 = iVar13 + pbVar2->vals[uVar19].n;
        }
      }
      else {
        uVar17 = kVar1 - 1 & __ptr[uVar15];
        iVar22 = 1;
        uVar19 = uVar17;
        do {
          bVar8 = (char)uVar19 * '\x02' & 0x1e;
          uVar14 = pbVar2->flags[uVar19 >> 4] >> bVar8;
          if (((uVar14 & 2) != 0) ||
             (((uVar14 & 1) == 0 && (pbVar2->keys[uVar19] == __ptr[uVar15])))) {
            if ((pbVar2->flags[uVar19 >> 4] >> bVar8 & 3) != 0) {
              uVar19 = kVar1;
            }
            goto LAB_0010ee46;
          }
          uVar19 = uVar19 + iVar22 & kVar1 - 1;
          iVar22 = iVar22 + 1;
        } while (uVar19 != uVar17);
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != uVar18);
    if (iVar13 == 0) {
      return phVar7;
    }
    a = (hts_pair64_t *)calloc((long)iVar13,0x10);
    if (0 < (int)uVar18) {
      uVar19 = pbVar2->n_buckets;
      uVar15 = 0;
      uVar17 = 0;
      do {
        uVar14 = 0;
        if (uVar19 == 0) {
LAB_0010ef0e:
          if (uVar14 != uVar19) {
            uVar9 = (ulong)pbVar2->vals[uVar14].n;
            if (0 < (long)uVar9) {
              puVar16 = &(pbVar2->vals[uVar14].list)->v;
              uVar20 = 0;
              do {
                if (uVar27 < *puVar16) {
                  lVar21 = (long)(int)uVar17;
                  uVar17 = uVar17 + 1;
                  uVar4 = *puVar16;
                  a[lVar21].u = ((hts_pair64_t *)(puVar16 + -1))->u;
                  a[lVar21].v = uVar4;
                }
                uVar20 = uVar20 + 1;
                puVar16 = puVar16 + 2;
              } while (uVar20 < uVar9);
            }
          }
        }
        else {
          uVar25 = uVar19 - 1 & __ptr[uVar15];
          iVar13 = 1;
          uVar14 = uVar25;
          do {
            bVar8 = (char)uVar14 * '\x02' & 0x1e;
            uVar26 = pbVar2->flags[uVar14 >> 4] >> bVar8;
            if (((uVar26 & 2) != 0) ||
               (((uVar26 & 1) == 0 && (pbVar2->keys[uVar14] == __ptr[uVar15])))) {
              if ((pbVar2->flags[uVar14 >> 4] >> bVar8 & 3) != 0) {
                uVar14 = uVar19;
              }
              goto LAB_0010ef0e;
            }
            uVar14 = uVar14 + iVar13 & uVar19 - 1;
            iVar13 = iVar13 + 1;
          } while (uVar14 != uVar25);
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 != uVar18);
      if (uVar17 != 0) {
        ks_introsort__off((long)(int)uVar17,a);
        iVar13 = 1;
        if (1 < (int)uVar17) {
          lVar21 = 0;
          uVar18 = 0;
          do {
            if (a[(int)uVar18].v < *(ulong *)((long)&a[1].v + lVar21)) {
              uVar27 = *(uint64_t *)((long)&a[1].v + lVar21);
              a[(long)(int)uVar18 + 1].u = *(uint64_t *)((long)&a[1].u + lVar21);
              a[(long)(int)uVar18 + 1].v = uVar27;
              uVar18 = uVar18 + 1;
            }
            lVar21 = lVar21 + 0x10;
          } while ((ulong)uVar17 * 0x10 + -0x10 != lVar21);
          if (0 < (int)uVar18) {
            lVar21 = 0;
            do {
              uVar15 = *(ulong *)((long)&a[1].u + lVar21);
              if (uVar15 <= *(ulong *)((long)&a->v + lVar21)) {
                *(ulong *)((long)&a->v + lVar21) = uVar15;
              }
              lVar21 = lVar21 + 0x10;
            } while ((ulong)uVar18 << 4 != lVar21);
            if (0 < (int)uVar18) {
              iVar13 = 0;
              lVar21 = 0x10;
              do {
                if ((*(ulong *)((long)&a->u + lVar21) ^ a[iVar13].v) < 0x10000) {
                  a[iVar13].v = *(uint64_t *)((long)&a->v + lVar21);
                }
                else {
                  puVar16 = (uint64_t *)((long)&a->u + lVar21);
                  uVar27 = puVar16[1];
                  a[(long)iVar13 + 1].u = *puVar16;
                  a[(long)iVar13 + 1].v = uVar27;
                  iVar13 = iVar13 + 1;
                }
                lVar21 = lVar21 + 0x10;
              } while ((ulong)uVar18 * 0x10 + 0x10 != lVar21);
              iVar13 = iVar13 + 1;
            }
          }
        }
        phVar7->n_off = iVar13;
        phVar7->off = a;
        return phVar7;
      }
    }
    free(a);
    return phVar7;
  }
  uVar15 = 0;
  switch(tid) {
  case -5:
    local_78 = 3;
    uVar15 = 0;
    goto LAB_0010f093;
  case -4:
    local_78 = 1;
    goto LAB_0010f093;
  case -3:
    local_78 = 1;
    if (0 < (long)idx->n) {
      uVar18 = idx->n_bins + 1;
      uVar15 = 0xffffffffffffffff;
      lVar21 = 0;
      do {
        pbVar2 = idx->bidx[lVar21];
        kVar1 = pbVar2->n_buckets;
        uVar19 = 0;
        if (kVar1 == 0) {
LAB_0010eaf2:
          if ((uVar19 != kVar1) && (uVar9 = (pbVar2->vals[uVar19].list)->u, uVar9 <= uVar15)) {
            uVar15 = uVar9;
          }
        }
        else {
          uVar17 = kVar1 - 1 & uVar18;
          iVar13 = 1;
          uVar19 = uVar17;
          do {
            bVar8 = (char)uVar19 * '\x02' & 0x1e;
            uVar14 = pbVar2->flags[uVar19 >> 4] >> bVar8;
            if (((uVar14 & 2) != 0) || (((uVar14 & 1) == 0 && (pbVar2->keys[uVar19] == uVar18)))) {
              if ((pbVar2->flags[uVar19 >> 4] >> bVar8 & 3) != 0) {
                uVar19 = kVar1;
              }
              goto LAB_0010eaf2;
            }
            uVar19 = uVar19 + iVar13 & kVar1 - 1;
            iVar13 = iVar13 + 1;
          } while (uVar19 != uVar17);
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 != idx->n);
      if (uVar15 != 0xffffffffffffffff) goto LAB_0010f093;
    }
    uVar27 = idx->n_no_coor;
    break;
  case -2:
    local_78 = 1;
    if (0 < (long)idx->n) {
      pbVar2 = idx->bidx[(long)idx->n + -1];
      uVar18 = pbVar2->n_buckets;
      if (uVar18 == 0) {
        uVar19 = 0;
LAB_0010f06c:
        if ((uVar19 != uVar18) &&
           (uVar15 = (pbVar2->vals[uVar19].list)->v, uVar15 != 0xffffffffffffffff))
        goto LAB_0010f093;
      }
      else {
        uVar17 = idx->n_bins + 1;
        uVar14 = uVar18 - 1 & uVar17;
        iVar13 = 1;
        uVar19 = uVar14;
        do {
          bVar8 = (char)uVar19 * '\x02' & 0x1e;
          uVar25 = pbVar2->flags[uVar19 >> 4] >> bVar8;
          if (((uVar25 & 2) != 0) || (((uVar25 & 1) == 0 && (pbVar2->keys[uVar19] == uVar17)))) {
            if ((pbVar2->flags[uVar19 >> 4] >> bVar8 & 3) != 0) {
              uVar19 = uVar18;
            }
            goto LAB_0010f06c;
          }
          uVar19 = uVar19 + iVar13 & uVar18 - 1;
          iVar13 = iVar13 + 1;
        } while (uVar19 != uVar14);
      }
    }
    uVar27 = idx->n_no_coor;
    break;
  default:
    goto LAB_0010f0b8;
  }
  local_78 = 1;
  uVar15 = 0;
  if (uVar27 == 0) {
LAB_0010f0b8:
    return (hts_itr_t *)0x0;
  }
LAB_0010f093:
  phVar7 = (hts_itr_t *)calloc(1,0x50);
  *(undefined4 *)phVar7 = local_78;
  phVar7->curr_off = uVar15;
  phVar7->readrec = readrec;
  return phVar7;
}

Assistant:

hts_itr_t *hts_itr_query(const hts_idx_t *idx, int tid, int beg, int end, hts_readrec_func *readrec)
{
    int i, n_off, l, bin;
    hts_pair64_t *off;
    khint_t k;
    bidx_t *bidx;
    uint64_t min_off;
    hts_itr_t *iter = 0;
    if (tid < 0) {
        int finished0 = 0;
        uint64_t off0 = (uint64_t)-1;
        khint_t k;
        switch (tid) {
        case HTS_IDX_START:
            // Find the smallest offset, note that sequence ids may not be ordered sequentially
            for (i=0; i<idx->n; i++)
            {
                bidx = idx->bidx[i];
                k = kh_get(bin, bidx, META_BIN(idx));
                if (k == kh_end(bidx)) continue;
                if ( off0 > kh_val(bidx, k).list[0].u ) off0 = kh_val(bidx, k).list[0].u;
            }
            if ( off0==(uint64_t)-1 && idx->n_no_coor ) off0 = 0; // only no-coor reads in this bam
            break;

        case HTS_IDX_NOCOOR:
            if ( idx->n>0 )
            {
                bidx = idx->bidx[idx->n - 1];
                k = kh_get(bin, bidx, META_BIN(idx));
                if (k != kh_end(bidx)) off0 = kh_val(bidx, k).list[0].v;
            }
            if ( off0==(uint64_t)-1 && idx->n_no_coor ) off0 = 0; // only no-coor reads in this bam
            break;

        case HTS_IDX_REST:
            off0 = 0;
            break;

        case HTS_IDX_NONE:
            finished0 = 1;
            off0 = 0;
            break;

        default:
            return 0;
        }
        if (off0 != (uint64_t)-1) {
            iter = (hts_itr_t*)calloc(1, sizeof(hts_itr_t));
            iter->read_rest = 1;
            iter->finished = finished0;
            iter->curr_off = off0;
            iter->readrec = readrec;
            return iter;
        } else return 0;
    }

    if (beg < 0) beg = 0;
    if (end < beg) return 0;
    if (tid >= idx->n || (bidx = idx->bidx[tid]) == NULL) return 0;

    iter = (hts_itr_t*)calloc(1, sizeof(hts_itr_t));
    iter->tid = tid, iter->beg = beg, iter->end = end; iter->i = -1;
    iter->readrec = readrec;

    // compute min_off
    bin = hts_bin_first(idx->n_lvls) + (beg>>idx->min_shift);
    do {
        int first;
        k = kh_get(bin, bidx, bin);
        if (k != kh_end(bidx)) break;
        first = (hts_bin_parent(bin)<<3) + 1;
        if (bin > first) --bin;
        else bin = hts_bin_parent(bin);
    } while (bin);
    if (bin == 0) k = kh_get(bin, bidx, bin);
    min_off = k != kh_end(bidx)? kh_val(bidx, k).loff : 0;
    // retrieve bins
    reg2bins(beg, end, iter, idx->min_shift, idx->n_lvls);
    for (i = n_off = 0; i < iter->bins.n; ++i)
        if ((k = kh_get(bin, bidx, iter->bins.a[i])) != kh_end(bidx))
            n_off += kh_value(bidx, k).n;
    if (n_off == 0) return iter;
    off = (hts_pair64_t*)calloc(n_off, sizeof(hts_pair64_t));
    for (i = n_off = 0; i < iter->bins.n; ++i) {
        if ((k = kh_get(bin, bidx, iter->bins.a[i])) != kh_end(bidx)) {
            int j;
            bins_t *p = &kh_value(bidx, k);
            for (j = 0; j < p->n; ++j)
                if (p->list[j].v > min_off) off[n_off++] = p->list[j];
        }
    }
    if (n_off == 0) {
        free(off); return iter;
    }
    ks_introsort(_off, n_off, off);
    // resolve completely contained adjacent blocks
    for (i = 1, l = 0; i < n_off; ++i)
        if (off[l].v < off[i].v) off[++l] = off[i];
    n_off = l + 1;
    // resolve overlaps between adjacent blocks; this may happen due to the merge in indexing
    for (i = 1; i < n_off; ++i)
        if (off[i-1].v >= off[i].u) off[i-1].v = off[i].u;
    // merge adjacent blocks
    for (i = 1, l = 0; i < n_off; ++i) {
        if (off[l].v>>16 == off[i].u>>16) off[l].v = off[i].v;
        else off[++l] = off[i];
    }
    n_off = l + 1;
    iter->n_off = n_off; iter->off = off;
    return iter;
}